

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * Extra_bddSupportNegativeCube(DdManager *dd,DdNode *f)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  DdNode *pDVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int index;
  DdNode *g;
  DdNode *f_00;
  
  uVar7 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar7 = dd->sizeZ;
  }
  piVar3 = (int *)malloc((long)(int)uVar7 << 2);
  if (piVar3 == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    uVar4 = 0;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      piVar3[uVar4] = 0;
    }
    ddSupportStep2((DdNode *)((ulong)f & 0xfffffffffffffffe),piVar3);
    ddClearFlag2((DdNode *)((ulong)f & 0xfffffffffffffffe));
    do {
      dd->reordered = 0;
      f_00 = dd->one;
      piVar1 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      uVar2 = uVar7;
      while (0 < (int)uVar2) {
        uVar8 = uVar2 - 1;
        if (dd->size < (int)uVar2) {
          index = uVar2 - 1;
        }
        else {
          index = dd->invperm[uVar8];
        }
        uVar2 = uVar8;
        if (piVar3[index] == 1) {
          pDVar5 = cuddUniqueInter(dd,index,dd->one,(DdNode *)((ulong)dd->one ^ 1));
          g = (DdNode *)((ulong)pDVar5 ^ 1);
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar5 = cuddBddAndRecur(dd,f_00,g);
          if (pDVar5 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,f_00);
            Cudd_RecursiveDeref(dd,g);
            f_00 = (DdNode *)0x0;
            break;
          }
          piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          Cudd_RecursiveDeref(dd,f_00);
          Cudd_RecursiveDeref(dd,g);
          f_00 = pDVar5;
        }
      }
    } while (dd->reordered == 1);
    free(piVar3);
    if (f_00 != (DdNode *)0x0) {
      piVar3 = (int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4);
      *piVar3 = *piVar3 + -1;
      return f_00;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Extra_bddSupportNegativeCube( DdManager * dd, DdNode * f )
{
    int *support;
    DdNode *res, *tmp, *var;
    int i, j;
    int size;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax( dd->size, dd->sizeZ );
    support = ABC_ALLOC( int, size );
    if ( support == NULL )
    {
        dd->errorCode = CUDD_MEMORY_OUT;
        return ( NULL );
    }
    for ( i = 0; i < size; i++ )
    {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    ddSupportStep2( Cudd_Regular( f ), support );
    ddClearFlag2( Cudd_Regular( f ) );

    /* Transform support from array to cube. */
    do
    {
        dd->reordered = 0;
        res = DD_ONE( dd );
        cuddRef( res );
        for ( j = size - 1; j >= 0; j-- )
        {                        /* for each level bottom-up */
            i = ( j >= dd->size ) ? j : dd->invperm[j];
            if ( support[i] == 1 )
            {
                var = cuddUniqueInter( dd, i, dd->one, Cudd_Not( dd->one ) );
                //////////////////////////////////////////////////////////////////
                var = Cudd_Not(var);
                //////////////////////////////////////////////////////////////////
                cuddRef( var );
                tmp = cuddBddAndRecur( dd, res, var );
                if ( tmp == NULL )
                {
                    Cudd_RecursiveDeref( dd, res );
                    Cudd_RecursiveDeref( dd, var );
                    res = NULL;
                    break;
                }
                cuddRef( tmp );
                Cudd_RecursiveDeref( dd, res );
                Cudd_RecursiveDeref( dd, var );
                res = tmp;
            }
        }
    }
    while ( dd->reordered == 1 );

    ABC_FREE( support );
    if ( res != NULL )
        cuddDeref( res );
    return ( res );

}